

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall FlowGraph::RunPeeps(FlowGraph *this)

{
  IRKind IVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  OpndKind OVar6;
  BOOL BVar7;
  uint sourceContextId;
  uint functionId;
  int32 iVar8;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar9;
  LabelInstr *pLVar10;
  LabelInstr *pLVar11;
  RegOpnd *pRVar12;
  Instr *pIVar13;
  uint uVar14;
  undefined **ppuVar15;
  LabelInstr *deadLabel;
  char *this_02;
  LabelInstr *local_38;
  
  BVar7 = Func::HasTry(this->func);
  if (BVar7 == 0) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,FGPeepsPhase,sourceContextId,functionId);
    if ((!bVar4) &&
       (deadLabel = (LabelInstr *)this->func->m_headInstr, deadLabel != (LabelInstr *)0x0)) {
      ppuVar15 = &PTR_0155fe48;
      puVar9 = (undefined4 *)__tls_get_addr();
      local_38 = (LabelInstr *)0x0;
      bVar4 = false;
      this_02 = (char *)ppuVar15;
      do {
        pLVar11 = (LabelInstr *)(deadLabel->super_Instr).m_next;
        OVar2 = (deadLabel->super_Instr).m_opcode;
        if (OVar2 < 0x176) {
          switch(OVar2) {
          case Br:
          case BrNotHasSideEffects:
          case BrFncNeqApply:
          case BrEq_A:
          case BrNeq_A:
          case BrGe_A:
          case BrGt_A:
          case BrLt_A:
          case BrLe_A:
          case BrSrEq_A:
          case BrSrNeq_A:
          case BrOnHasLocalProperty:
          case BrOnObject_A:
          case BrNotNull_A:
          case BrOnNotNullObj_A:
            goto switchD_00416288_caseD_18c;
          case BrFalse_A:
          case BrTrue_A:
            goto switchD_00416288_caseD_1a6;
          case BrOnHasLocalEnvProperty:
          case EndSwitch:
          case Case:
          case BeginSwitch:
          case ProfiledBeginSwitch:
          case CallI:
          case CallIFlags:
          case CallIExtended:
          case CallIExtendedFlags:
          case Throw:
          case Ret:
          case Yield:
          case Incr_A:
          case Decr_A:
          case Neg_A:
          case Not_A:
          case Typeof:
          case TypeofElem:
          case ApplyArgs:
          case Add_A:
          case Div_A:
          case ProfiledDiv_A:
          case Mul_A:
          case Rem_A:
          case ProfiledRem_A:
          case Sub_A:
          case Expo_A:
          case And_A:
          case Or_A:
          case Xor_A:
          case Shl_A:
          case Shr_A:
            break;
          case ShrU_A:
            goto switchD_00416288_caseD_1cc;
          case CmEq_A:
          case CmGe_A:
          case CmGt_A:
          case CmLt_A:
          case CmLe_A:
          case CmNeq_A:
          case CmSrEq_A:
          case CmSrNeq_A:
            goto switchD_00416288_caseD_1d3;
          default:
            uVar14 = OVar2 - 0xe6;
            if ((uVar14 < 0x39) && ((0x1c0000130000001U >> ((ulong)uVar14 & 0x3f) & 1) != 0))
            goto switchD_00416288_caseD_18c;
          }
          goto switchD_00416288_caseD_177;
        }
        switch(OVar2) {
        case Label:
          IVar1 = (deadLabel->super_Instr).m_kind;
          if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            this_02 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
            ;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar5) goto LAB_00416674;
            *puVar9 = 0;
          }
          if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
               (deadLabel->labelRefs).
               super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next == &deadLabel->labelRefs) &&
             ((deadLabel->field_0x78 & 4) == 0)) {
            IVar1 = (deadLabel->super_Instr).m_kind;
            if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar5) goto LAB_00416674;
              *puVar9 = 0;
            }
            pLVar11 = (LabelInstr *)Peeps::PeepUnreachableLabel(deadLabel,false,(bool *)0x0);
            this_02 = (char *)deadLabel;
          }
          break;
        case StatementBoundary:
          IR::Instr::ClearByteCodeOffset(&deadLabel->super_Instr);
          pIVar13 = IR::Instr::GetNextRealInstrOrLabel(&deadLabel->super_Instr);
          IR::Instr::SetByteCodeOffset(&deadLabel->super_Instr,pIVar13);
          this_02 = (char *)deadLabel;
          break;
        case MultiBr:
          break;
        case BrHasSideEffects:
        case BrFncEqApply:
        case BrUnGe_A:
        case BrUnGt_A:
        case BrUnLt_A:
        case BrUnLe_A:
        case BrOnNoLocalProperty:
        case BrNotEq_A:
        case BrNotNeq_A:
        case BrSrNotEq_A:
        case BrSrNotNeq_A:
        case BrNotGe_A:
        case BrNotGt_A:
        case BrNotLt_A:
        case BrNotLe_A:
        case BrNotAddr_A:
        case BrAddr_A:
        case BrEq_I4:
        case BrGe_I4:
        case BrUnGe_I4:
        case BrGt_I4:
        case BrUnGt_I4:
        case BrLt_I4:
        case BrUnLt_I4:
        case BrLe_I4:
        case BrUnLe_I4:
        case BrNeq_I4:
switchD_00416288_caseD_18c:
          if (bVar4) {
            UnsignedCmpPeep(this,&deadLabel->super_Instr);
          }
          if ((deadLabel->super_Instr).m_kind != InstrKindBranch) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
            if (!bVar5) goto LAB_00416674;
            *puVar9 = 0;
          }
          pLVar11 = (LabelInstr *)Peeps::PeepBranch((BranchInstr *)deadLabel,(bool *)0x0);
          this_02 = (char *)deadLabel;
          break;
        case BrTrue_I4:
        case BrFalse_I4:
switchD_00416288_caseD_1a6:
          if (local_38 == (LabelInstr *)0x0) {
            if ((deadLabel->super_Instr).m_kind != InstrKindBranch) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
              if (!bVar5) goto LAB_00416674;
              *puVar9 = 0;
            }
            pLVar11 = (LabelInstr *)Peeps::PeepBranch((BranchInstr *)deadLabel,(bool *)0x0);
            this_02 = (char *)deadLabel;
          }
          else {
            if (((local_38->super_Instr).m_dst)->m_type == TyInt32) {
              if ((OVar2 & ~ExtendedOpcodePrefix) != BrTrue_I4) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar9 = 1;
                this_02 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                ;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                   ,0x369,
                                   "(instr->m_opcode == Js::OpCode::BrTrue_I4 || instr->m_opcode == Js::OpCode::BrFalse_I4)"
                                   ,
                                   "instr->m_opcode == Js::OpCode::BrTrue_I4 || instr->m_opcode == Js::OpCode::BrFalse_I4"
                                  );
                if (!bVar5) goto LAB_00416674;
                *puVar9 = 0;
              }
              pLVar10 = (LabelInstr *)PeepTypedCm((FlowGraph *)this_02,&local_38->super_Instr);
            }
            else {
              this_02 = (char *)this;
              pLVar10 = (LabelInstr *)PeepCm(this,&local_38->super_Instr);
            }
            pLVar11 = deadLabel;
            if (pLVar10 != (LabelInstr *)0x0) {
              pLVar11 = pLVar10;
            }
          }
          local_38 = (LabelInstr *)0x0;
          break;
        case ShrU_I4:
switchD_00416288_caseD_1cc:
          if (!bVar4) {
            pLVar10 = (LabelInstr *)(deadLabel->super_Instr).m_dst;
            this_02 = (char *)pLVar10;
            OVar6 = IR::Opnd::GetKind((Opnd *)pLVar10);
            if (OVar6 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              this_02 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
              ;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar5) goto LAB_00416674;
              *puVar9 = 0;
            }
            pIVar13 = (pLVar10->super_Instr).m_next;
            if ((((ulong)pIVar13->m_prev & 1) != 0) &&
               (pIVar13->globOptInstrString != (char16 *)0x0)) {
              this_02 = (char *)(deadLabel->super_Instr).m_src2;
              OVar6 = IR::Opnd::GetKind((Opnd *)this_02);
              if (OVar6 == OpndKindReg) {
                pRVar12 = IR::Opnd::AsRegOpnd((deadLabel->super_Instr).m_src2);
                this_02 = (char *)pRVar12->m_sym;
                bVar5 = StackSym::IsTaggableIntConst((StackSym *)this_02);
                if (bVar5) {
                  pRVar12 = IR::Opnd::AsRegOpnd((deadLabel->super_Instr).m_src2);
                  this_02 = (char *)pRVar12->m_sym;
                  iVar8 = StackSym::GetIntConstValue((StackSym *)this_02);
                  bVar4 = iVar8 == 0;
                }
              }
            }
          }
          break;
        case CmEq_I4:
        case CmNeq_I4:
        case CmLt_I4:
        case CmLe_I4:
        case CmGt_I4:
        case CmGe_I4:
switchD_00416288_caseD_1d3:
          if (bVar4) {
            this_02 = (char *)this;
            UnsignedCmpPeep(this,&deadLabel->super_Instr);
          }
        case CmUnGe_A:
        case CmUnGt_A:
        case CmUnLt_A:
        case CmUnLe_A:
        case CmUnLt_I4:
        case CmUnLe_I4:
        case CmUnGt_I4:
        case CmUnGe_I4:
          local_38 = deadLabel;
          break;
        default:
          if ((OVar2 - 0x282 < 2) || (OVar2 == BrOnNotEmpty)) goto switchD_00416288_caseD_18c;
        case FunctionEntry:
        case FunctionExit:
        case SpreadArrayLiteral:
        case ClearAttributes:
        case LdHomeObj:
        case LdFuncObj:
        case LdHomeObjProto:
        case LdFuncObjProto:
        case ImportCall:
        case BeginBodyScope:
        case SpreadObjectLiteral:
        case StPropIdArrFromVar:
        case Restify:
        case NewPropIdArrForCompProps:
        case Conv_Numeric:
        case Incr_Num_A:
        case Decr_Num_A:
        case ByteCodeLast:
        case LoweredStartCall:
        case BrOnNoEnvProperty:
        case BrOnException:
        case BrOnNoException:
        case DeadBrEqual:
        case DeadBrSrEqual:
        case DeadBrRelational:
        case DeadBrOnHasProperty:
        case DeletedNonHelperBranch:
        case Call:
        case AsmJsCallI:
        case AsmJsCallE:
        case CallINew:
        case CallINewTargetNew:
        case CallIExtendedNew:
        case CallIEval:
        case CallIExtendedNewTargetNew:
        case CallIDynamic:
        case CallIDynamicSpread:
        case CallDirect:
        case InlineThrow:
        case EHThrow:
        case Neg_I4:
        case Not_I4:
        case Add_I4:
        case Sub_I4:
        case Mul_I4:
        case Div_I4:
        case DivU_I4:
        case Rem_I4:
        case RemU_I4:
        case And_I4:
        case Or_I4:
        case Xor_I4:
        case Shl_I4:
        case Shr_I4:
        case Rol_I4:
        case Ror_I4:
switchD_00416288_caseD_177:
          if ((deadLabel->super_Instr).m_kind == InstrKindBranch) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            this_02 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
            ;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x3b7,"(!instr->IsBranchInstr())","!instr->IsBranchInstr()");
            if (!bVar5) {
LAB_00416674:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar9 = 0;
          }
        }
        deadLabel = pLVar11;
      } while (pLVar11 != (LabelInstr *)0x0);
    }
  }
  return;
}

Assistant:

void
FlowGraph::RunPeeps()
{
    if (this->func->HasTry())
    {
        return;
    }

    if (PHASE_OFF(Js::FGPeepsPhase, this->func))
    {
        return;
    }

    IR::Instr * instrCm = nullptr;
    bool tryUnsignedCmpPeep = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        switch(instr->m_opcode)
        {
        case Js::OpCode::Br:
        case Js::OpCode::BrEq_I4:
        case Js::OpCode::BrGe_I4:
        case Js::OpCode::BrGt_I4:
        case Js::OpCode::BrLt_I4:
        case Js::OpCode::BrLe_I4:
        case Js::OpCode::BrUnGe_I4:
        case Js::OpCode::BrUnGt_I4:
        case Js::OpCode::BrUnLt_I4:
        case Js::OpCode::BrUnLe_I4:
        case Js::OpCode::BrNeq_I4:
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrGe_A:
        case Js::OpCode::BrGt_A:
        case Js::OpCode::BrLt_A:
        case Js::OpCode::BrLe_A:
        case Js::OpCode::BrUnGe_A:
        case Js::OpCode::BrUnGt_A:
        case Js::OpCode::BrUnLt_A:
        case Js::OpCode::BrUnLe_A:
        case Js::OpCode::BrNotEq_A:
        case Js::OpCode::BrNotNeq_A:
        case Js::OpCode::BrSrNotEq_A:
        case Js::OpCode::BrSrNotNeq_A:
        case Js::OpCode::BrNotGe_A:
        case Js::OpCode::BrNotGt_A:
        case Js::OpCode::BrNotLt_A:
        case Js::OpCode::BrNotLe_A:
        case Js::OpCode::BrNeq_A:
        case Js::OpCode::BrNotNull_A:
        case Js::OpCode::BrNotAddr_A:
        case Js::OpCode::BrAddr_A:
        case Js::OpCode::BrSrEq_A:
        case Js::OpCode::BrSrNeq_A:
        case Js::OpCode::BrOnHasProperty:
        case Js::OpCode::BrOnNoProperty:
        case Js::OpCode::BrOnHasLocalProperty:
        case Js::OpCode::BrOnNoLocalProperty:
        case Js::OpCode::BrHasSideEffects:
        case Js::OpCode::BrNotHasSideEffects:
        case Js::OpCode::BrFncEqApply:
        case Js::OpCode::BrFncNeqApply:
        case Js::OpCode::BrOnEmpty:
        case Js::OpCode::BrOnNotEmpty:
        case Js::OpCode::BrFncCachedScopeEq:
        case Js::OpCode::BrFncCachedScopeNeq:
        case Js::OpCode::BrOnObject_A:
        case Js::OpCode::BrOnClassConstructor:
        case Js::OpCode::BrOnBaseConstructorKind:
        case Js::OpCode::BrOnObjectOrNull_A:
        case Js::OpCode::BrOnNotNullObj_A:
        case Js::OpCode::BrOnConstructor_A:
            if (tryUnsignedCmpPeep)
            {
                this->UnsignedCmpPeep(instr);
            }
            instrNext = Peeps::PeepBranch(instr->AsBranchInstr());
            break;

        case Js::OpCode::MultiBr:
            // TODO: Run peeps on these as well...
            break;

        case Js::OpCode::BrTrue_I4:
        case Js::OpCode::BrFalse_I4:
        case Js::OpCode::BrTrue_A:
        case Js::OpCode::BrFalse_A:
            if (instrCm)
            {
                if (instrCm->GetDst()->IsInt32())
                {
                    Assert(instr->m_opcode == Js::OpCode::BrTrue_I4 || instr->m_opcode == Js::OpCode::BrFalse_I4);
                    instrNext = this->PeepTypedCm(instrCm);
                }
                else
                {
                    instrNext = this->PeepCm(instrCm);
                }
                instrCm = nullptr;

                if (instrNext == nullptr)
                {
                    // Set instrNext back to the current instr.
                    instrNext = instr;
                }
            }
            else
            {
                instrNext = Peeps::PeepBranch(instr->AsBranchInstr());
            }
            break;

        case Js::OpCode::CmEq_I4:
        case Js::OpCode::CmGe_I4:
        case Js::OpCode::CmGt_I4:
        case Js::OpCode::CmLt_I4:
        case Js::OpCode::CmLe_I4:
        case Js::OpCode::CmNeq_I4:
        case Js::OpCode::CmEq_A:
        case Js::OpCode::CmGe_A:
        case Js::OpCode::CmGt_A:
        case Js::OpCode::CmLt_A:
        case Js::OpCode::CmLe_A:
        case Js::OpCode::CmNeq_A:
        case Js::OpCode::CmSrEq_A:
        case Js::OpCode::CmSrNeq_A:
            if (tryUnsignedCmpPeep)
            {
                this->UnsignedCmpPeep(instr);
            }
        case Js::OpCode::CmUnGe_I4:
        case Js::OpCode::CmUnGt_I4:
        case Js::OpCode::CmUnLt_I4:
        case Js::OpCode::CmUnLe_I4:
        case Js::OpCode::CmUnGe_A:
        case Js::OpCode::CmUnGt_A:
        case Js::OpCode::CmUnLt_A:
        case Js::OpCode::CmUnLe_A:
            // There may be useless branches between the Cm instr and the branch that uses the result.
            // So save the last Cm instr seen, and trigger the peep on the next BrTrue/BrFalse.
            instrCm = instr;
            break;

        case Js::OpCode::Label:
            if (instr->AsLabelInstr()->IsUnreferenced())
            {
                instrNext = Peeps::PeepUnreachableLabel(instr->AsLabelInstr(), false);
            }
            break;

        case Js::OpCode::StatementBoundary:
            instr->ClearByteCodeOffset();
            instr->SetByteCodeOffset(instr->GetNextRealInstrOrLabel());
            break;

        case Js::OpCode::ShrU_I4:
        case Js::OpCode::ShrU_A:
            if (tryUnsignedCmpPeep)
            {
                break;
            }
            if (instr->GetDst()->AsRegOpnd()->m_sym->IsSingleDef()
                && instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->AsRegOpnd()->m_sym->IsTaggableIntConst()
                && instr->GetSrc2()->AsRegOpnd()->m_sym->GetIntConstValue() == 0)
            {
                tryUnsignedCmpPeep = true;
            }
            break;
        default:
            Assert(!instr->IsBranchInstr());
        }
   } NEXT_INSTR_IN_FUNC_EDITING;
}